

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O0

void __thiscall Start::checkForCreditsAndBet(Start *this,double *credits,uint *bet)

{
  ostream *poVar1;
  uint *bet_local;
  double *credits_local;
  Start *this_local;
  
  if ((*credits <= (double)*bet && (double)*bet != *credits) && (1.0 <= *credits)) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Automatic change bet to min!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Not Enough Credits for Max Bet!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    *bet = 1;
  }
  return;
}

Assistant:

void Start::checkForCreditsAndBet(double& credits, unsigned int& bet) {
	if (bet > credits && credits >= 1) {
		std::cout << "Automatic change bet to min!" << std::endl;
		std::cout << "Not Enough Credits for Max Bet!" << std::endl;
		bet = 1;
	}
}